

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

bool cmState::IsCacheEntryType(string *key)

{
  int iVar1;
  char **ppcVar2;
  bool bVar3;
  
  bVar3 = cmCacheEntryTypes[0] != (char *)0x0;
  if ((bVar3) && (iVar1 = std::__cxx11::string::compare((char *)key), iVar1 != 0)) {
    ppcVar2 = cmCacheEntryTypes;
    do {
      ppcVar2 = ppcVar2 + 1;
      bVar3 = *ppcVar2 != (char *)0x0;
      if (*ppcVar2 == (char *)0x0) {
        return bVar3;
      }
      iVar1 = std::__cxx11::string::compare((char *)key);
    } while (iVar1 != 0);
  }
  return bVar3;
}

Assistant:

bool cmState::IsCacheEntryType(std::string const& key)
{
  for (int i = 0; cmCacheEntryTypes[i]; ++i) {
    if (key == cmCacheEntryTypes[i]) {
      return true;
    }
  }
  return false;
}